

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_ret(void)

{
  uint uVar1;
  undefined4 *puVar2;
  uint ret_1;
  uint num_1;
  uint ret;
  uint num;
  uint8_t high;
  
  if (code_ptr[registe_ptr->IP + 1] == '\x05') {
    uVar1 = *(uint *)(stack_ptr + registe_ptr->SP);
    registe_ptr->SP = registe_ptr->SP - 4;
    registe_ptr->IP = uVar1;
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x06') {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0xf6;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    uVar1 = *(uint *)(stack_ptr +
                     ((ulong)registe_ptr->SP -
                     (ulong)*(uint *)(code_ptr + (ulong)registe_ptr->IP + 2)));
    registe_ptr->SP = registe_ptr->SP - (*(uint *)(code_ptr + (ulong)registe_ptr->IP + 2) + 4);
    registe_ptr->IP = uVar1;
  }
  return 1;
}

Assistant:

int do_ret() {
	if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器读数
		uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
		unsigned num = *register_list[high];
		unsigned ret = *(unsigned*)(stack_ptr+registe_ptr->SP);
		registe_ptr->SP = registe_ptr->SP-4;
		registe_ptr->IP = ret; // 修改
	}
	else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数读数
		unsigned num = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
		unsigned ret = *(unsigned*)(stack_ptr+registe_ptr->SP-num);
		registe_ptr->SP = registe_ptr->SP- (num+4);
		registe_ptr->IP = ret ;//修改
	}
	else throw(LVM_EXECUTE_ERROR);

	return LVM_SUCCESS;
}